

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::createSurfaceCustomAllocatorTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  VkInstance instance;
  RefData<vk::Handle<(vk::HandleType)25>_> data;
  Type TVar1;
  bool bVar2;
  VkAllocationCallbacks *pVVar3;
  TestContext *this;
  TestLog *log_00;
  VkInstance_s **ppVVar4;
  Display *nativeDisplay;
  Window *nativeWindow;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  RecordIterator local_360;
  RecordIterator local_348;
  allocator<char> local_329;
  string local_328;
  uint local_308;
  allocator<char> local_301;
  string local_300;
  Move<vk::Handle<(vk::HandleType)25>_> local_2e0;
  RefData<vk::Handle<(vk::HandleType)25>_> local_2c0;
  undefined1 local_2a0 [8];
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  undefined1 local_270 [8];
  NativeObjects native;
  InstanceHelper instHelper;
  TestLog *log;
  AllocationCallbackRecorder allocationRecorder;
  Type wsiType_local;
  Context *context_local;
  
  allocationRecorder.m_records.m_last._4_4_ = wsiType;
  pVVar3 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&log,pVVar3,0x400);
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  TVar1 = allocationRecorder.m_records.m_last._4_4_;
  pVVar3 = ::vk::AllocationCallbacks::getCallbacks((AllocationCallbacks *)&log);
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8,context,TVar1,pVVar3);
  TVar1 = allocationRecorder.m_records.m_last._4_4_;
  tcu::nothing<tcu::Vector<unsigned_int,2>>();
  NativeObjects::NativeObjects
            ((NativeObjects *)local_270,context,
             (Extensions *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8,TVar1,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)
             &surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe
            ((Maybe<tcu::Vector<unsigned_int,_2>_> *)
             &surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  TVar1 = allocationRecorder.m_records.m_last._4_4_;
  instance = *ppVVar4;
  nativeDisplay =
       de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::operator*
                 ((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_270);
  nativeWindow = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
                 operator*((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
                           &native.display.
                            super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
                            .m_data.field_0x8);
  pVVar3 = ::vk::AllocationCallbacks::getCallbacks((AllocationCallbacks *)&log);
  ::vk::wsi::createSurface
            (&local_2e0,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             instance,TVar1,nativeDisplay,nativeWindow,pVVar3);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2c0,(Move *)&local_2e0);
  data.deleter.m_instanceIface = local_2c0.deleter.m_instanceIface;
  data.object.m_internal = local_2c0.object.m_internal;
  data.deleter.m_instance = local_2c0.deleter.m_instance;
  data.deleter.m_allocator = local_2c0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_2a0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move(&local_2e0);
  bVar2 = ::vk::validateAndLog(log_00,(AllocationCallbackRecorder *)&log,0x12);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"Detected invalid system allocation callback",&local_301);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
  }
  local_308 = (uint)!bVar2;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_2a0);
  NativeObjects::~NativeObjects((NativeObjects *)local_270);
  InstanceHelper::~InstanceHelper
            ((InstanceHelper *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8);
  if (local_308 == 0) {
    bVar2 = ::vk::validateAndLog(log_00,(AllocationCallbackRecorder *)&log,0);
    if (bVar2) {
      ::vk::AllocationCallbackRecorder::getRecordsBegin
                (&local_348,(AllocationCallbackRecorder *)&log);
      ::vk::AllocationCallbackRecorder::getRecordsEnd(&local_360,(AllocationCallbackRecorder *)&log)
      ;
      bVar2 = de::AppendList<vk::AllocationCallbackRecord>::
              Iterator<const_vk::AllocationCallbackRecord>::operator==(&local_348,&local_360);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_380,"Allocation callbacks were not used",&local_381);
        tcu::TestStatus::TestStatus
                  (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_380);
        std::__cxx11::string::~string((string *)&local_380);
        std::allocator<char>::~allocator(&local_381);
        local_308 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"Creating surface succeeded using custom allocator",
                   &local_3a9);
        tcu::TestStatus::pass(__return_storage_ptr__,&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator(&local_3a9);
        local_308 = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"Detected invalid system allocation callback",&local_329);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      local_308 = 1;
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder((AllocationCallbackRecorder *)&log);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSurfaceCustomAllocatorTest (Context& context, Type wsiType)
{
	AllocationCallbackRecorder	allocationRecorder	(getSystemAllocator());
	tcu::TestLog&				log					= context.getTestContext().getLog();

	{
		const InstanceHelper		instHelper	(context, wsiType, allocationRecorder.getCallbacks());
		const NativeObjects			native		(context, instHelper.supportedExtensions, wsiType);
		const Unique<VkSurfaceKHR>	surface		(createSurface(instHelper.vki,
															   *instHelper.instance,
															   wsiType,
															   *native.display,
															   *native.window,
															   allocationRecorder.getCallbacks()));

		if (!validateAndLog(log,
							allocationRecorder,
							(1u<<VK_SYSTEM_ALLOCATION_SCOPE_OBJECT)		|
							(1u<<VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)))
			return tcu::TestStatus::fail("Detected invalid system allocation callback");
	}

	if (!validateAndLog(log, allocationRecorder, 0u))
		return tcu::TestStatus::fail("Detected invalid system allocation callback");

	if (allocationRecorder.getRecordsBegin() == allocationRecorder.getRecordsEnd())
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks were not used");
	else
		return tcu::TestStatus::pass("Creating surface succeeded using custom allocator");
}